

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DestListHeader.cpp
# Opt level: O2

void __thiscall DestListHeader::printDestListHeader(DestListHeader *this)

{
  ostream *poVar1;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> _Stack_a8;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_90;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_78;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_60;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_48;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_30;
  
  poVar1 = std::operator<<((ostream *)&std::cout,
                           "____________________DestListHeader______________________");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"Version:                            ");
  *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) =
       *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) & 0xffffffb5 | 2;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_30,&this->Version);
  Utils::lenFourBytes((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_30);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_30);
  poVar1 = std::operator<<((ostream *)&std::cout,(string *)&Utils::defaultOffsetDocInfo_abi_cxx11_);
  poVar1 = std::operator<<(poVar1,"1 - for Windows 7");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,(string *)&Utils::defaultOffsetDocInfo_abi_cxx11_);
  poVar1 = std::operator<<(poVar1,"    for Windows 8");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,(string *)&Utils::defaultOffsetDocInfo_abi_cxx11_);
  poVar1 = std::operator<<(poVar1,"3 - for Windows 10");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,(string *)&Utils::defaultOffsetDocInfo_abi_cxx11_);
  poVar1 = std::operator<<(poVar1,"4 - for Windows 10");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"TotalNumberOfCurrentEntries:        ");
  *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) =
       *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) & 0xffffffb5 | 2;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_48,
             &this->TotalNumberOfCurrentEntries);
  Utils::lenFourBytes((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_48);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_48);
  poVar1 = std::operator<<((ostream *)&std::cout,"TotalNumberOfPinnedEntries:         ");
  *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) =
       *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) & 0xffffffb5 | 2;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_60,
             &this->TotalNumberOfPinnedEntries);
  Utils::lenFourBytes((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_60);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_60);
  std::operator<<((ostream *)&std::cout,"Unknown:                            ");
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_78,&this->Unknown);
  Utils::print_vec((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_78);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_78);
  poVar1 = std::operator<<((ostream *)&std::cout,"LastIssuedEntryId:                  ");
  *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) =
       *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) & 0xffffffb5 | 2;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_90,
             &this->LastIssuedEntryId);
  Utils::vectEightBytesToUnsignedInt
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_90,0);
  poVar1 = std::ostream::_M_insert<long_long>((longlong)poVar1);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_90);
  poVar1 = std::operator<<((ostream *)&std::cout,"NumberOfAddedDeletedReopened:       ");
  *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) =
       *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) & 0xffffffb5 | 2;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&_Stack_a8,
             &this->NumberOfAddedDeletedReopened);
  Utils::vectEightBytesToUnsignedInt
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&_Stack_a8,0);
  poVar1 = std::ostream::_M_insert<long_long>((longlong)poVar1);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&_Stack_a8);
  poVar1 = std::operator<<((ostream *)&std::cout,
                           "_________________________________________________________");
  std::endl<char,std::char_traits<char>>(poVar1);
  return;
}

Assistant:

void DestListHeader::printDestListHeader() {
    cout << "____________________DestListHeader______________________" << endl;
    cout << "Version:                            " << dec<< Utils::lenFourBytes(Version) << endl;
        cout << Utils::defaultOffsetDocInfo << "1 - for Windows 7" << endl;
        cout << Utils::defaultOffsetDocInfo << "    for Windows 8" << endl;
        cout << Utils::defaultOffsetDocInfo << "3 - for Windows 10" << endl;
        cout << Utils::defaultOffsetDocInfo << "4 - for Windows 10" << endl;
    cout << "TotalNumberOfCurrentEntries:        " << dec<< Utils::lenFourBytes(TotalNumberOfCurrentEntries) << endl;
    cout << "TotalNumberOfPinnedEntries:         " << dec<< Utils::lenFourBytes(TotalNumberOfPinnedEntries) << endl;
    cout << "Unknown:                            "; Utils::print_vec(Unknown);
    cout << "LastIssuedEntryId:                  " << dec <<
         Utils::vectEightBytesToUnsignedInt(LastIssuedEntryId, 0) << endl;
    cout << "NumberOfAddedDeletedReopened:       " << dec <<
         Utils::vectEightBytesToUnsignedInt(NumberOfAddedDeletedReopened, 0) << endl;
    cout << "_________________________________________________________" << endl;
}